

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall cfdcapi_psbt_CreatePsbt_Test::TestBody(cfdcapi_psbt_CreatePsbt_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  uint32_t version;
  int iVar4;
  char *pcVar5;
  char *in_RDI;
  char *in_R9;
  int unaff_retaddr;
  void *in_stack_00000008;
  void **in_stack_00000020;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  uint32_t index;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int64_t amount1;
  AssertionResult gtest_ar_1;
  char *output;
  char *output_base64;
  char *exp_psbt;
  char *exp_psbt_base64;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  uint32_t *in_stack_000005a0;
  char *in_stack_000005a8;
  char *in_stack_000005b0;
  int64_t in_stack_000005b8;
  void *in_stack_000005c0;
  void *in_stack_000005c8;
  int64_t in_stack_00000798;
  uint32_t in_stack_000007a0;
  uint32_t in_stack_000007a4;
  char *in_stack_000007a8;
  void *in_stack_000007b0;
  void *in_stack_000007b8;
  char *in_stack_000007d0;
  char *in_stack_000007d8;
  char *in_stack_000007e0;
  bool *in_stack_fffffffffffffaf8;
  char *in_stack_fffffffffffffb00;
  CfdErrorCode *in_stack_fffffffffffffb08;
  CfdErrorCode *pCVar6;
  char *in_stack_fffffffffffffb10;
  void **in_stack_fffffffffffffb18;
  AssertionResult *pAVar7;
  undefined7 in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  char **in_stack_fffffffffffffc30;
  undefined7 in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  AssertHelper local_348;
  Message local_340;
  undefined4 local_334;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  undefined4 local_30c;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  AssertionResult local_2e8;
  AssertHelper local_2d8;
  Message local_2d0;
  AssertionResult local_2c8;
  AssertHelper local_2b8;
  Message local_2b0;
  undefined4 local_2a4;
  AssertionResult local_2a0;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_27c;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  undefined4 local_254;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  undefined4 local_204;
  AssertionResult local_200;
  undefined4 local_1ec;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined4 local_1d4;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined4 local_1ac;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined4 local_184;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_134;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  undefined8 local_f8;
  AssertHelper local_f0;
  Message local_e8;
  undefined4 local_dc;
  AssertionResult local_d8;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  uint32_t in_stack_ffffffffffffffe8;
  char *pcVar8;
  
  pcVar8 = (char *)0x0;
  version = CfdCreateHandle(in_stack_fffffffffffffb18);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (int *)in_stack_fffffffffffffb00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x37e80a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x35,pcVar5);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x37e86d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x37e8c2);
  local_61 = pcVar8 != (char *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(type *)0x37e8f6
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x36,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x37e9f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x37ea6d);
  local_9c = 1;
  local_a8 = 0;
  local_b0 = 
  "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA=="
  ;
  local_b8 = 
  "70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
  ;
  local_c0 = (char *)0x0;
  local_c8 = (char *)0x0;
  iVar4 = CfdCreatePsbtHandle(in_stack_00000008,unaff_retaddr,in_RDI,pcVar8,version,
                              in_stack_ffffffffffffffe8,in_stack_00000020);
  local_dc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (int *)in_stack_fffffffffffffb00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x37eba3);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x40,pcVar8);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message((Message *)0x37ec06);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x37ec5e);
  if (iVar4 == 0) {
    local_f8 = 10000000;
    pcVar8 = 
    "wpkh([2a704760/44h/0h/0h/1/1]02565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe)"
    ;
    pCVar6 = (CfdErrorCode *)0x0;
    CfdAddPsbtTxInWithPubkey
              (in_stack_000007b8,in_stack_000007b0,in_stack_000007a8,in_stack_000007a4,
               in_stack_000007a0,in_stack_00000798,in_stack_000007d0,in_stack_000007d8,
               in_stack_000007e0);
    local_10c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,pCVar6,(int *)pcVar8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x37ed7b);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x48,pcVar8);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message((Message *)0x37edde);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37ee36);
    pcVar8 = 
    "wpkh([2a704760/44h/0h/0h/1/2]022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b)"
    ;
    pCVar6 = (CfdErrorCode *)0x0;
    CfdAddPsbtTxInWithPubkey
              (in_stack_000007b8,in_stack_000007b0,in_stack_000007a8,in_stack_000007a4,
               in_stack_000007a0,in_stack_00000798,in_stack_000007d0,in_stack_000007d8,
               in_stack_000007e0);
    local_134 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,pCVar6,(int *)pcVar8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      in_stack_fffffffffffffc48 =
           testing::AssertionResult::failure_message((AssertionResult *)0x37ef39);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4f,in_stack_fffffffffffffc48);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x37ef9c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37eff4);
    pcVar8 = 
    "wpkh([2a704760/44h/0h/0h/1/3]02e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855)"
    ;
    pCVar6 = (CfdErrorCode *)0x0;
    CfdAddPsbtTxInWithPubkey
              (in_stack_000007b8,in_stack_000007b0,in_stack_000007a8,in_stack_000007a4,
               in_stack_000007a0,in_stack_00000798,in_stack_000007d0,in_stack_000007d8,
               in_stack_000007e0);
    local_15c = 0;
    pAVar7 = &local_158;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,pCVar6,(int *)pcVar8);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_168);
      in_stack_fffffffffffffc30 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x37f0f7);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x56,(char *)in_stack_fffffffffffffc30);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message((Message *)0x37f15a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f1b2);
    pcVar8 = 
    "wpkh([2a704760/44h/0h/0h/1/4]033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44)"
    ;
    pCVar6 = (CfdErrorCode *)0x0;
    CfdAddPsbtTxInWithPubkey
              (in_stack_000007b8,in_stack_000007b0,in_stack_000007a8,in_stack_000007a4,
               in_stack_000007a0,in_stack_00000798,in_stack_000007d0,in_stack_000007d8,
               in_stack_000007e0);
    local_184 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,pCVar6,(int *)pcVar8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x37f2b5);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x5d,pcVar8);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      testing::Message::~Message((Message *)0x37f318);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f370);
    pcVar8 = 
    "wpkh([2a704760/44h/0h/0h/1/5]02fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504)"
    ;
    pCVar6 = (CfdErrorCode *)0x0;
    CfdAddPsbtTxInWithPubkey
              (in_stack_000007b8,in_stack_000007b0,in_stack_000007a8,in_stack_000007a4,
               in_stack_000007a0,in_stack_00000798,in_stack_000007d0,in_stack_000007d8,
               in_stack_000007e0);
    local_1ac = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,pCVar6,(int *)pcVar8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x37f473);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,100,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      testing::Message::~Message((Message *)0x37f4d6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f52e);
    in_stack_fffffffffffffb00 =
         "wpkh([9d6b6d86/44h/0h/0h/1/1]03e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec)"
    ;
    pcVar8 = "";
    in_stack_fffffffffffffb08 = (CfdErrorCode *)0x0;
    CfdAddPsbtTxInWithPubkey
              (in_stack_000007b8,in_stack_000007b0,in_stack_000007a8,in_stack_000007a4,
               in_stack_000007a0,in_stack_00000798,in_stack_000007d0,in_stack_000007d8,
               in_stack_000007e0);
    local_1d4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
               ,(int *)in_stack_fffffffffffffb00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x37f62f);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x6b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      testing::Message::~Message((Message *)0x37f692);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f6ea);
    local_1ec = 0;
    CfdAddPsbtTxOutWithPubkey
              (in_stack_000005c8,in_stack_000005c0,in_stack_000005b8,in_stack_000005b0,
               in_stack_000005a8,in_stack_000005a0);
    local_204 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
               ,(int *)in_stack_fffffffffffffb00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
    if (!bVar1) {
      testing::Message::Message(&local_210);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x37f7d9);
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x72,pcVar5);
      testing::internal::AssertHelper::operator=(&local_218,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      testing::Message::~Message((Message *)0x37f83c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f891);
    local_22c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
               ,(uint *)in_stack_fffffffffffffb00,pcVar8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      in_stack_fffffffffffffbb8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x37f943);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x73,in_stack_fffffffffffffbb8);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x37f9a6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f9fe);
    CfdAddPsbtTxOutWithPubkey
              (in_stack_000005c8,in_stack_000005c0,in_stack_000005b8,in_stack_000005b0,
               in_stack_000005a8,in_stack_000005a0);
    local_254 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
               ,(int *)in_stack_fffffffffffffb00);
    uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_250);
    if (!(bool)uVar3) {
      testing::Message::Message(&local_260);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x37fae2);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x79,pcVar8);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message((Message *)0x37fb45);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37fb9a);
    local_27c = 1;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
               ,(uint *)in_stack_fffffffffffffb00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar1) {
      testing::Message::Message(&local_288);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x37fc47);
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x7a,pcVar8);
      testing::internal::AssertHelper::operator=(&local_290,&local_288);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      testing::Message::~Message((Message *)0x37fcaa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37fd02);
    iVar4 = CfdGetPsbtData(in_stack_fffffffffffffc48,
                           (void *)CONCAT17(uVar2,in_stack_fffffffffffffc40),(char **)pAVar7,
                           in_stack_fffffffffffffc30);
    local_2a4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
               ,(int *)in_stack_fffffffffffffb00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_2b0);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x37fddb);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x7d,pcVar8);
      testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
      testing::internal::AssertHelper::~AssertHelper(&local_2b8);
      testing::Message::~Message((Message *)0x37fe38);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37fe8d);
    if (iVar4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2c8,"exp_psbt_base64","output_base64",local_b0,local_c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
      if (!bVar1) {
        testing::Message::Message(&local_2d0);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x37ff31);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x7f,pcVar8);
        testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
        testing::internal::AssertHelper::~AssertHelper(&local_2d8);
        testing::Message::~Message((Message *)0x37ff8e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x37ffe3);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2e8,"exp_psbt","output",local_b8,local_c8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
      if (!bVar1) {
        testing::Message::Message(&local_2f0);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x380079);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x80,pcVar8);
        testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
        testing::internal::AssertHelper::~AssertHelper(&local_2f8);
        testing::Message::~Message((Message *)0x3800d6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x38012b);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffb08);
      local_c0 = (char *)0x0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffb08);
      local_c8 = (char *)0x0;
    }
    CfdFreePsbtHandle(in_stack_fffffffffffffbb8,(void *)CONCAT17(uVar3,in_stack_fffffffffffffbb0));
    local_30c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
               ,(int *)in_stack_fffffffffffffb00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x38021c);
      testing::internal::AssertHelper::AssertHelper
                (&local_320,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x88,pcVar8);
      testing::internal::AssertHelper::operator=(&local_320,&local_318);
      testing::internal::AssertHelper::~AssertHelper(&local_320);
      testing::Message::~Message((Message *)0x380279);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3802ce);
  }
  CfdFreeHandle(in_stack_fffffffffffffb08);
  local_334 = 0;
  pAVar7 = &local_330;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&pAVar7->success_,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (int *)in_stack_fffffffffffffb00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x380385);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x8c,pcVar8);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    testing::Message::~Message((Message *)0x3803e2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x380437);
  return;
}

Assistant:

TEST(cfdcapi_psbt, CreatePsbt) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt_base64 = "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==";
  const char* exp_psbt = "70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000";
  char* output_base64 = nullptr;
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "", "", 2, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    int64_t amount1 = 0x989680;
    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "de31e525f45b534afb2bbe83a5a0a40f6684722246785f81fc83e1b57cda34f8", 1,
        0xffffffff, amount1, "",
        "wpkh([2a704760/44h/0h/0h/1/1]02565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "8182ee7dfc1ebfd594097adfee2147f78f8e90c0e8b9e51a952476ce3b6aef5a", 2,
        0xffffffff, amount1, "",
        "wpkh([2a704760/44h/0h/0h/1/2]022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "3fd9692b7a7cdab3784adcc4890028e706b1e59c8e934414fd9e785249d62da9", 3,
        0xffffffff, amount1, "",
        "wpkh([2a704760/44h/0h/0h/1/3]02e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "d105c429100625998ac4e58464830119b581604ef5485e95451988b87b2cf7fc", 4,
        0xffffffff, amount1, "",
        "wpkh([2a704760/44h/0h/0h/1/4]033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "b98f570401eb46bded2d3efb41aba9090d014f083a0ad2d232c8229a4d1abea0", 5,
        0xffffffff, amount1, "",
        "wpkh([2a704760/44h/0h/0h/1/5]02fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "95b6bec453093ab0e4291eca70449476988c9ad6053377432c3e655bbf41a171", 1,
        0xffffffff, 0x2faf080, "",
        "wpkh([9d6b6d86/44h/0h/0h/1/1]03e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    uint32_t index = 0;
    ret = CfdAddPsbtTxOutWithPubkey(handle, psbt_handle,
        50000000, "",
        "wpkh([2a704760/44h/0h/0h/0/2]03473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81)",
        &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);

    ret = CfdAddPsbtTxOutWithPubkey(handle, psbt_handle,
        50000000, "",
        "wpkh([9d6b6d86/44h/0h/0h/0/2]036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c)",
        &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);

    ret = CfdGetPsbtData(handle, psbt_handle, &output_base64, &output);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt_base64, output_base64);
      EXPECT_STREQ(exp_psbt, output);
      CfdFreeStringBuffer(output_base64);
      output_base64 = nullptr;
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}